

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O1

int WebRtcIsac_GetCrc(int16_t *bitstream,int len_bitstream_in_bytes,uint32_t *crc)

{
  uint uVar1;
  ulong uVar2;
  
  if (bitstream != (int16_t *)0x0) {
    uVar1 = 0;
    if (0 < len_bitstream_in_bytes) {
      uVar1 = 0xffffffff;
      uVar2 = 0;
      do {
        uVar1 = uVar1 << 8 ^ kCrcTable[(uint)*(byte *)((long)bitstream + uVar2) ^ uVar1 >> 0x18];
        uVar2 = uVar2 + 1;
      } while ((uint)len_bitstream_in_bytes != uVar2);
      uVar1 = ~uVar1;
    }
    *crc = uVar1;
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcIsac_GetCrc(const int16_t* bitstream,
                      int len_bitstream_in_bytes,
                      uint32_t* crc)
{
  uint8_t* bitstream_ptr_uw8;
  uint32_t crc_state;
  int byte_cntr;
  int crc_tbl_indx;

  /* Sanity Check. */
  if (bitstream == NULL) {
    return -1;
  }
  /* cast to UWord8 pointer */
  bitstream_ptr_uw8 = (uint8_t *)bitstream;

  /* initialize */
  crc_state = 0xFFFFFFFF;

  for (byte_cntr = 0; byte_cntr < len_bitstream_in_bytes; byte_cntr++) {
    crc_tbl_indx = (WEBRTC_SPL_RSHIFT_U32(crc_state, 24) ^
                       bitstream_ptr_uw8[byte_cntr]) & 0xFF;
    crc_state = (crc_state << 8) ^ kCrcTable[crc_tbl_indx];
  }

  *crc = ~crc_state;
  return 0;
}